

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O0

void Abc_NtkPerformIfif(Abc_Ntk_t *pNtk,Ifif_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_IffMan_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar4;
  Abc_IffObj_t *pAVar5;
  char *pcVar6;
  float fVar7;
  int local_50;
  uint local_4c;
  int Count10;
  int d;
  int i;
  float DegreeFinal;
  float Delay10;
  float Delay;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_IffObj_t *pIffObj;
  Abc_IffMan_t *p;
  Ifif_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((pPars->pLutLib->LutMax < 0) || (6 < pPars->pLutLib->LutMax)) {
    __assert_fail("pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x107,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if ((-1 < pPars->nLutSize) && (pPars->nLutSize < 7)) {
    if ((-1 < pPars->nDegree) && (pPars->nDegree < 7)) {
      Abc_NtkToAig(pNtk);
      Abc_NtkLevel(pNtk);
      if (pPars->fVerbose != 0) {
        printf("Running mapper into LUT structures with the following parameters:\n");
        printf("Pin+Wire: {");
        for (Count10 = 0; Count10 < pPars->pLutLib->LutMax; Count10 = Count10 + 1) {
          printf(" %3.2f",(double)pPars->pLutDelays[Count10]);
        }
        printf(" }  ");
        pcVar6 = "Cluster";
        if (pPars->fCascade != 0) {
          pcVar6 = "Cascade";
        }
        printf("Wire %3.2f  Degree %d  Type: %s\n",(double)pPars->DelayWire,
               (ulong)(uint)pPars->nDegree,pcVar6);
      }
      p_00 = Abc_NtkIfifStart(pNtk,pPars);
      p_01 = Abc_NtkDfs(pNtk,0);
      Count10 = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(p_01);
        if (iVar1 <= Count10) {
          if (pPars->fCascade == 0) {
            d = 0x3f800000;
          }
          else {
            d = (int)(float)pPars->nDegree;
          }
          if (p_00->pPars->fVeryVerbose != 0) {
            for (Count10 = 0; iVar1 = Vec_PtrSize(p_01), Count10 < iVar1; Count10 = Count10 + 1) {
              pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,Count10);
              uVar2 = Abc_ObjId(pAVar4);
              uVar3 = Abc_ObjLevel(pAVar4);
              printf("Node %3d : Lev =%3d   ",(ulong)uVar2,(ulong)uVar3);
              for (local_4c = 0; (float)(int)local_4c <= (float)d; local_4c = local_4c + 1) {
                fVar7 = Abc_IffDelay(p_00,pAVar4,local_4c);
                printf("Del%d =%4.2f  ",(double)fVar7,(ulong)local_4c);
              }
              printf("\n");
            }
          }
          Vec_PtrFree(p_01);
          DegreeFinal = 0.0;
          for (Count10 = 0; iVar1 = Abc_NtkCoNum(pNtk), Count10 < iVar1; Count10 = Count10 + 1) {
            pAVar4 = Abc_NtkCo(pNtk,Count10);
            pAVar4 = Abc_ObjFanin0(pAVar4);
            fVar7 = Abc_IffDelay(p_00,pAVar4,(int)(float)d);
            DegreeFinal = Abc_MaxFloat(DegreeFinal,fVar7);
          }
          local_50 = 0;
          for (Count10 = 0; iVar1 = Abc_NtkCoNum(pNtk), Count10 < iVar1; Count10 = Count10 + 1) {
            pAVar4 = Abc_NtkCo(pNtk,Count10);
            pAVar4 = Abc_ObjFanin0(pAVar4);
            fVar7 = Abc_IffDelay(p_00,pAVar4,(int)(float)d);
            if (DegreeFinal * 0.9 <= fVar7) {
              local_50 = local_50 + 1;
            }
          }
          iVar1 = Abc_NtkCoNum(pNtk);
          printf("Critical delay %5.2f. Critical outputs %5.2f %%\n",(double)DegreeFinal,
                 ((double)local_50 * 100.0) / (double)iVar1);
          Abc_NtkIfifStop(p_00);
          return;
        }
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,Count10);
        iVar1 = Abc_ObjIsNode(pAVar4);
        if (iVar1 == 0) break;
        uVar2 = Abc_ObjId(pAVar4);
        pAVar5 = Abc_IffObj(p_00,uVar2);
        if (pPars->fCascade == 0) {
          fVar7 = Abc_ObjDelay0(p_00,pAVar4);
          pAVar5->Delay[0] = fVar7;
          fVar7 = Abc_ObjDelay1(p_00,pAVar4);
          pAVar5->Delay[1] = fVar7;
        }
        else {
          for (local_4c = 0; (int)local_4c <= pPars->nDegree; local_4c = local_4c + 1) {
            fVar7 = Abc_ObjDelayDegree(p_00,pAVar4,local_4c);
            pAVar5->Delay[(int)local_4c] = fVar7;
          }
        }
        Count10 = Count10 + 1;
      }
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                    ,0x122,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
    }
    __assert_fail("pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x109,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  __assert_fail("pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                ,0x108,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
}

Assistant:

void Abc_NtkPerformIfif( Abc_Ntk_t * pNtk, Ifif_Par_t * pPars )
{
    Abc_IffMan_t * p;
    Abc_IffObj_t * pIffObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    float Delay, Delay10, DegreeFinal;
    int i, d, Count10;
    assert( pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES );
    assert( pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES );
    assert( pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES );
    // convert to AIGs
    Abc_NtkToAig( pNtk );
    Abc_NtkLevel( pNtk );

    // print parameters
    if ( pPars->fVerbose )
    {
        printf( "Running mapper into LUT structures with the following parameters:\n" );
        printf( "Pin+Wire: {" );
        for ( i = 0; i < pPars->pLutLib->LutMax; i++ )
            printf( " %3.2f", pPars->pLutDelays[i] );
        printf( " }  " );    
        printf( "Wire %3.2f  Degree %d  Type: %s\n", 
            pPars->DelayWire, pPars->nDegree, pPars->fCascade? "Cascade" : "Cluster" );
    }

    // start manager
    p = Abc_NtkIfifStart( pNtk, pPars );
//    printf( "Running experiment with LUT delay %d and degree %d (LUT size is %d).\n", DelayWire, nDegree, nLutSize );

    // compute the delay
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pIffObj = Abc_IffObj( p, Abc_ObjId(pObj) );

        if ( pPars->fCascade )
        {
            for ( d = 0; d <= pPars->nDegree; d++ )
                pIffObj->Delay[d] = Abc_ObjDelayDegree( p, pObj, d );
        }
        else
        {
            pIffObj->Delay[0] = Abc_ObjDelay0( p, pObj );
            pIffObj->Delay[1] = Abc_ObjDelay1( p, pObj );
        }
    }

    // get final degree number
    if ( pPars->fCascade )
        DegreeFinal = pPars->nDegree;
    else
        DegreeFinal = 1;

    if ( p->pPars->fVeryVerbose )
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        printf( "Node %3d : Lev =%3d   ",  Abc_ObjId(pObj), Abc_ObjLevel(pObj) );
        for ( d = 0; d <= DegreeFinal; d++ )
            printf( "Del%d =%4.2f  ", d, Abc_IffDelay(p, pObj, d) );
        printf( "\n" );
    }
    Vec_PtrFree( vNodes );


    // consider delay at the outputs
    Delay = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        Delay = Abc_MaxFloat( Delay, Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) );
    Delay10 = 0.9 * Delay;

    // consider delay at the outputs
    Count10 = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        if ( Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) >= Delay10 )
            Count10++;

    printf( "Critical delay %5.2f. Critical outputs %5.2f %%\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );
//    printf( "%.2f %.2f\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );

    // derive a new network

    // stop manager
    Abc_NtkIfifStop( p );
}